

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O3

void __thiscall pybind11::buffer_info::~buffer_info(buffer_info *this)

{
  if ((*(long *)(this + 0x78) != 0) && (this[0x80] == (buffer_info)0x1)) {
    PyBuffer_Release();
    operator_delete(*(void **)(this + 0x78));
  }
  if (*(void **)(this + 0x58) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x58));
  }
  if (*(void **)(this + 0x40) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x40));
  }
  if (*(buffer_info **)(this + 0x18) != this + 0x28) {
    operator_delete(*(buffer_info **)(this + 0x18));
    return;
  }
  return;
}

Assistant:

~buffer_info() {
        if (m_view && ownview) { PyBuffer_Release(m_view); delete m_view; }
    }